

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

void __thiscall
AlphaVectorPlanning::AlphaVectorPlanning
          (AlphaVectorPlanning *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  int *piVar1;
  sp_counted_base *psVar2;
  sp_counted_base *psVar3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  bool bVar8;
  undefined1 auVar9 [64];
  
  TimedAlgorithm::TimedAlgorithm(&this->super_TimedAlgorithm);
  (this->super_TimedAlgorithm)._vptr_TimedAlgorithm =
       (_func_int **)&PTR__AlphaVectorPlanning_005a8f98;
  this->_m_pu = (PlanningUnitDecPOMDPDiscrete *)0x0;
  psVar2 = (pu->pn).pi_;
  psVar3 = (pu->pn).pi_;
  (this->_m_puShared).px = pu->px;
  (this->_m_puShared).pn.pi_ = psVar3;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  auVar9 = ZEXT864(0) << 0x20;
  *(undefined1 (*) [64])
   &(this->_m_OsForBackup).
    super__Vector_base<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar9;
  *(undefined1 (*) [64])
   &(this->_m_Oes).
    super__Vector_base<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar9;
  *(undefined1 (*) [64])
   &(this->_m_Ts).
    super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar9;
  this->_m_T = (vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                )auVar9._0_24_;
  this->_m_O = (vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                )auVar9._24_24_;
  (this->_m_Ts).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._48_8_;
  (this->_m_Ts).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar9._56_8_;
  pPVar4 = this->_m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->_m_puShared).px;
  }
  lVar5 = (**(code **)((long)*(pPVar4->super_PlanningUnitMADPDiscrete)._m_madp + 0x130))();
  if (lVar5 != 0) {
    lVar6 = __dynamic_cast(lVar5,&TransitionModelDiscrete::typeinfo,
                           &TransitionModelMappingSparse::typeinfo,0);
    bVar8 = true;
    if (lVar6 == 0) {
      bVar8 = false;
      lVar5 = __dynamic_cast(lVar5,&TransitionModelDiscrete::typeinfo,
                             &TransitionModelMapping::typeinfo,0);
      if (lVar5 == 0) goto LAB_0039f593;
    }
    this->_m_useSparse = bVar8;
    this->_m_initialized = false;
    return;
  }
LAB_0039f593:
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar7 = &PTR__E_0059bd80;
  puVar7[1] = puVar7 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar7 + 1),
             "AlphaVectorPlanning::Ctor() TransitionModelDiscretePtr not handled. Use the --cache-flat-models option."
             ,"");
  __cxa_throw(puVar7,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorPlanning::AlphaVectorPlanning(const boost::shared_ptr<const 
                                         PlanningUnitDecPOMDPDiscrete> &pu) :
    _m_pu(0),
    _m_puShared(pu),
    _m_TsForBackup(0),
    _m_OsForBackup(0),
    _m_eventOsForBackup(0),
    _m_TsOsForBackup(0)
{
    const TransitionModelMappingSparse *tms;
    const TransitionModelMapping *tm;
    const TransitionModelDiscrete *td=GetPU()->GetTransitionModelDiscretePtr();

    if((tms=dynamic_cast<const TransitionModelMappingSparse *>(td)))
        _m_useSparse=true;
    else if((tm=dynamic_cast<const TransitionModelMapping *>(td)))
        _m_useSparse=false;
    else 
        throw(E("AlphaVectorPlanning::Ctor() TransitionModelDiscretePtr not handled. Use the --cache-flat-models option."));

    _m_initialized=false;
}